

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

int __thiscall despot::EvalLog::GetNumCompletedRuns(EvalLog *this)

{
  size_type sVar1;
  const_reference pvVar2;
  int local_18;
  int local_14;
  int i;
  int num;
  EvalLog *this_local;
  
  local_14 = 0;
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->num_of_completed_runs);
    if (sVar1 <= (ulong)(long)local_18) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->num_of_completed_runs,(long)local_18);
    local_14 = *pvVar2 + local_14;
    local_18 = local_18 + 1;
  }
  return local_14;
}

Assistant:

int EvalLog::GetNumCompletedRuns() const {
	int num = 0;
	for (int i = 0; i < num_of_completed_runs.size(); i++)
		num += num_of_completed_runs[i];
	return num;
}